

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRational.cpp
# Opt level: O0

double Imf_3_4::anon_unknown_1::denom(double x,double e)

{
  double in_XMM0_Qa;
  double dVar1;
  double x_00;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double r;
  double in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffb0;
  double x_01;
  undefined8 local_8;
  
  dVar3 = in_XMM1_Qa;
  dVar1 = frac(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (in_XMM1_Qa <= dVar1) {
    dVar1 = frac(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (dVar3 <= dVar1) {
      x_00 = frac(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      x_01 = dVar3;
      square(in_XMM0_Qa * dVar1);
      local_8 = denom(x_01,dVar1);
      dVar2 = floor(1.0 / in_XMM0_Qa + x_01);
      frac(x_00,dVar3);
      square(in_XMM0_Qa);
      dVar3 = denom(x_01,dVar1);
      local_8 = dVar2 * dVar3 + local_8;
    }
    else {
      local_8 = floor(1.0 / in_XMM0_Qa + dVar3);
    }
  }
  else {
    local_8 = 1.0;
  }
  return local_8;
}

Assistant:

double
denom (double x, double e)
{
    if (e > frac (x, e)) { return 1; }
    else
    {
        double r = frac (1 / x, e);

        if (e > r) { return floor (1 / x + e); }
        else
        {
            return denom (frac (1 / r, e), e / square (x * r)) +
                   floor (1 / x + e) * denom (frac (1 / x, e), e / square (x));
        }
    }
}